

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

int absl::base_internal::LLA_SkiplistLevels(size_t size,size_t base,uint32_t *random)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint32_t uVar6;
  
  uVar3 = size - 0x28;
  lVar4 = 0;
  for (; base < size; size = size >> 1) {
    lVar4 = lVar4 + 1;
  }
  uVar3 = uVar3 >> 3;
  if (random == (uint32_t *)0x0) {
    uVar5 = 1;
  }
  else {
    uVar6 = *random;
    uVar5 = 0;
    do {
      uVar6 = uVar6 * 0x41c64e6d + 0x3039;
      uVar5 = uVar5 + 1;
    } while ((uVar6 >> 0x1e & 1) == 0);
    *random = uVar6;
  }
  iVar1 = (int)((ulong)uVar5 + lVar4);
  if (uVar3 < (ulong)uVar5 + lVar4) {
    iVar1 = (int)uVar3;
  }
  if (iVar1 < 1) {
    raw_logging_internal::RawLog
              (kFatal,"low_level_alloc.cc",0x94,"Check %s failed: %s","level >= 1",
               "block not big enough for even one level");
  }
  iVar2 = 0x1d;
  if (iVar1 < 0x1d) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

static int LLA_SkiplistLevels(size_t size, size_t base, uint32_t *random) {
  // max_fit is the maximum number of levels that will fit in a node for the
  // given size.   We can't return more than max_fit, no matter what the
  // random number generator says.
  size_t max_fit = (size - offsetof(AllocList, next)) / sizeof(AllocList *);
  int level = IntLog2(size, base) + (random != nullptr ? Random(random) : 1);
  if (static_cast<size_t>(level) > max_fit) level = static_cast<int>(max_fit);
  if (level > kMaxLevel-1) level = kMaxLevel - 1;
  ABSL_RAW_CHECK(level >= 1, "block not big enough for even one level");
  return level;
}